

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk64(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk64_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk64.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk64.version);
    if ((bios->power).unk64.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk64.offset + 1,&(bios->power).unk64.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk64.offset + 2,&(bios->power).unk64.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk64.offset + 3,&(bios->power).unk64.entriesnum);
      (bios->power).unk64.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk64.entriesnum;
      peVar5 = (envy_bios_power_unk64_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk64.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk64.rlen * (int)uVar6 +
             (uint)(bios->power).unk64.hlen + (bios->power).unk64.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown FAN TEST table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk64(struct envy_bios *bios) {
	struct envy_bios_power_unk64 *unk64 = &bios->power.unk64;
	int i, err = 0;

	if (!unk64->offset)
		return -EINVAL;

	bios_u8(bios, unk64->offset + 0x0, &unk64->version);
	switch(unk64->version) {
	case 0x10:
		err |= bios_u8(bios, unk64->offset + 0x1, &unk64->hlen);
		err |= bios_u8(bios, unk64->offset + 0x2, &unk64->rlen);
		err |= bios_u8(bios, unk64->offset + 0x3, &unk64->entriesnum);
		unk64->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN TEST table version 0x%x\n", unk64->version);
		return -EINVAL;
	};

	err = 0;
	unk64->entries = malloc(unk64->entriesnum * sizeof(struct envy_bios_power_unk64_entry));
	for (i = 0; i < unk64->entriesnum; i++) {
		uint32_t data = unk64->offset + unk64->hlen + i * unk64->rlen;

		unk64->entries[i].offset = data;
	}

	return 0;
}